

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::Array::Array(Array *this,Type *type,LengthInfo *length_info_arg)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Type).kind_ = kArray;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Array_003ec948;
  this->element_type_ = type;
  (this->length_info_).id = length_info_arg->id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->length_info_).words,&length_info_arg->words);
  if (type == (Type *)0x0) {
    __assert_fail("type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                  ,0x1a5,
                  "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
  }
  iVar1 = (*type->_vptr_Type[6])(type);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    if (4 < (ulong)((long)(length_info_arg->words).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(length_info_arg->words).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      return;
    }
    __assert_fail("length_info_arg.words.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                  ,0x1a9,
                  "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
  }
  __assert_fail("!type->AsVoid()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                ,0x1a6,
                "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
}

Assistant:

Array::Array(const Type* type, const Array::LengthInfo& length_info_arg)
    : Type(kArray), element_type_(type), length_info_(length_info_arg) {
  assert(type != nullptr);
  assert(!type->AsVoid());
  // We always have a word to say which case we're in, followed
  // by at least one more word.
  assert(length_info_arg.words.size() >= 2);
}